

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialog::setNameFilters(QFileDialog *this,QStringList *filters)

{
  QFileDialogPrivate *this_00;
  Ui_QFileDialog *pUVar1;
  QComboBox *this_01;
  char cVar2;
  int iVar3;
  long lVar4;
  QString *filter;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_58,(filters->d).size);
  lVar4 = (filters->d).size;
  if (lVar4 != 0) {
    lVar4 = lVar4 * 0x18;
    do {
      QString::simplified_helper((QString *)&local_70);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_58,local_58.size,(QString *)&local_70);
      QList<QString>::end((QList<QString> *)&local_58);
      if (&(local_70.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d)->super_QArrayData,2,0x10);
        }
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  QFileDialogOptions::setNameFilters((QList_conflict *)(this_00->options).value.ptr);
  pUVar1 = (this_00->qFileDialogUi).d;
  if (pUVar1 != (Ui_QFileDialog *)0x0 && (this_00->super_QDialogPrivate).nativeDialogInUse == false)
  {
    QComboBox::clear(pUVar1->fileTypeCombo);
    if (local_58.size != 0) {
      cVar2 = QFileDialogOptions::testOption
                        ((FileDialogOption)
                         *(undefined8 *)
                          (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x3d0));
      this_01 = ((this_00->qFileDialogUi).d)->fileTypeCombo;
      if (cVar2 == '\0') {
        iVar3 = QComboBox::count(this_01);
        QComboBox::insertItems(this_01,iVar3,(QStringList *)&local_58);
      }
      else {
        qt_strip_filters((QStringList *)&local_70,(QStringList *)&local_58);
        iVar3 = QComboBox::count(this_01);
        QComboBox::insertItems(this_01,iVar3,(QStringList *)&local_70);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      }
      QFileDialogPrivate::useNameFilter(this_00,0);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setNameFilters(const QStringList &filters)
{
    Q_D(QFileDialog);
    QStringList cleanedFilters;
    cleanedFilters.reserve(filters.size());
    for (const QString &filter : filters)
        cleanedFilters << filter.simplified();

    d->options->setNameFilters(cleanedFilters);

    if (!d->usingWidgets())
        return;

    d->qFileDialogUi->fileTypeCombo->clear();
    if (cleanedFilters.isEmpty())
        return;

    if (testOption(HideNameFilterDetails))
        d->qFileDialogUi->fileTypeCombo->addItems(qt_strip_filters(cleanedFilters));
    else
        d->qFileDialogUi->fileTypeCombo->addItems(cleanedFilters);

    d->useNameFilter(0);
}